

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_still_impl.cpp
# Opt level: O0

bool __thiscall
raspicam::_private::Private_Impl_Still::takePicture
          (Private_Impl_Still *this,uchar *preallocated_data,uint length)

{
  Private_Impl_Still *this_00;
  undefined4 in_EDX;
  MMAL_PORT_T *in_RSI;
  MMAL_COMPONENT_T *in_RDI;
  RASPICAM_USERDATA *userdata;
  sem_t mutex;
  int ret;
  Private_Impl_Still *in_stack_ffffffffffffff98;
  Private_Impl_Still *in_stack_ffffffffffffffa0;
  sem_t local_40;
  int local_20;
  undefined4 local_1c;
  MMAL_PORT_T *local_18;
  bool local_1;
  
  local_1c = in_EDX;
  local_18 = in_RSI;
  initialize(in_stack_ffffffffffffff98);
  local_20 = 0;
  sem_init(&local_40,0,0);
  this_00 = (Private_Impl_Still *)operator_new(0x38);
  memset(this_00,0,0x38);
  this_00->camera = in_RDI;
  this_00->encoder = *(MMAL_COMPONENT_T **)&in_RDI->is_enabled;
  this_00->encoder_pool = (MMAL_POOL_T *)&local_40;
  this_00->camera_still_port = local_18;
  *(undefined4 *)&this_00->encoder_input_port = 0;
  *(undefined4 *)&this_00->encoder_output_port = 0;
  *(undefined4 *)((long)&this_00->encoder_input_port + 4) = 0;
  *(undefined4 *)((long)&this_00->encoder_output_port + 4) = local_1c;
  this_00->encoder_connection = (MMAL_CONNECTION_T *)0x0;
  in_RDI->input[10] = (MMAL_PORT_T *)this_00;
  local_20 = startCapture(this_00);
  if (local_20 == 0) {
    sem_wait(&local_40);
    sem_destroy(&local_40);
    stopCapture(in_stack_ffffffffffffffa0);
    if (this_00 != (Private_Impl_Still *)0x0) {
      operator_delete(this_00,0x38);
    }
    local_1 = true;
  }
  else {
    if (this_00 != (Private_Impl_Still *)0x0) {
      operator_delete(this_00,0x38);
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Private_Impl_Still::takePicture ( unsigned char * preallocated_data, unsigned int length ) {
            initialize();
            int ret = 0;
            sem_t mutex;
            sem_init ( &mutex, 0, 0 );
            RASPICAM_USERDATA * userdata = new RASPICAM_USERDATA();
            userdata->cameraBoard = this;
            userdata->encoderPool = encoder_pool;
            userdata->mutex = &mutex;
            userdata->data = preallocated_data;
            userdata->bufferPosition = 0;
            userdata->offset = 0;
            userdata->startingOffset = 0;
            userdata->length = length;
            userdata->imageCallback = NULL;
            encoder_output_port->userdata = ( struct MMAL_PORT_USERDATA_T * ) userdata;
            if ( ( ret = startCapture() ) != 0 ) {
                delete userdata;
                return false;
            }
            sem_wait ( &mutex );
            sem_destroy ( &mutex );
            stopCapture();
            delete userdata;

            return true;
        }